

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O1

ssize_t __thiscall Pl_Function::write(Pl_Function *this,int __fd,void *__buf,size_t __n)

{
  _Any_data *p_Var1;
  Pipeline *pPVar2;
  int iVar3;
  ssize_t sVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  uchar *puVar5;
  void *local_28;
  uchar *local_20;
  
  puVar5 = (uchar *)CONCAT44(in_register_00000034,__fd);
  p_Var1 = (_Any_data *)
           (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
           .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl;
  local_28 = __buf;
  local_20 = puVar5;
  if (*(long *)(p_Var1 + 1) != 0) {
    sVar4 = (**(code **)((long)p_Var1 + 0x18))(p_Var1,&local_20,(unsigned_long *)&local_28);
    pPVar2 = (this->super_Pipeline).next_;
    if (pPVar2 != (Pipeline *)0x0) {
      iVar3 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,puVar5,__buf);
      sVar4 = CONCAT44(extraout_var,iVar3);
    }
    return sVar4;
  }
  std::__throw_bad_function_call();
}

Assistant:

void
Pl_Function::write(unsigned char const* buf, size_t len)
{
    m->fn(buf, len);
    if (next()) {
        next()->write(buf, len);
    }
}